

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O3

void Luv32toLuv48(LogLuvState *sp,uint8_t *op,tmsize_t n)

{
  uint uVar1;
  uint *puVar2;
  ulong uVar3;
  int16_t *luv3;
  undefined1 auVar4 [16];
  ulong uVar5;
  
  if (0 < n) {
    puVar2 = (uint *)sp->tbuf;
    uVar3 = n + 1;
    do {
      uVar1 = *puVar2;
      uVar5 = CONCAT44(uVar1,uVar1 >> 8) & 0xff000000ff;
      *(short *)op = (short)(uVar1 >> 0x10);
      auVar4._0_4_ = (int)(((double)(int)uVar5 + 0.5) * 0.0024390243902439024 * 32768.0);
      auVar4._4_4_ = (int)(((double)(int)(uVar5 >> 0x20) + 0.5) * 0.0024390243902439024 * 32768.0);
      auVar4._8_8_ = 0;
      auVar4 = pshuflw(auVar4,auVar4,0xe8);
      *(int *)(op + 2) = auVar4._0_4_;
      puVar2 = puVar2 + 1;
      uVar3 = uVar3 - 1;
      op = op + 6;
    } while (1 < uVar3);
  }
  return;
}

Assistant:

static void Luv32toLuv48(LogLuvState *sp, uint8_t *op, tmsize_t n)
{
    uint32_t *luv = (uint32_t *)sp->tbuf;
    int16_t *luv3 = (int16_t *)op;

    while (n-- > 0)
    {
        double u, v;

        *luv3++ = (int16_t)(*luv >> 16);
        u = 1. / UVSCALE * ((*luv >> 8 & 0xff) + .5);
        v = 1. / UVSCALE * ((*luv & 0xff) + .5);
        *luv3++ = (int16_t)(u * (1L << 15));
        *luv3++ = (int16_t)(v * (1L << 15));
        luv++;
    }
}